

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

Acb_Ntk_t * Acb_NtkAlloc(Acb_Man_t *p,int NameId,int nCis,int nCos,int nObjs)

{
  Acb_Ntk_t *Entry;
  
  Entry = (Acb_Ntk_t *)calloc(1,0x238);
  if (-1 < (nCos | nCis | nObjs)) {
    Entry->Id = (p->vNtks).nSize;
    Vec_PtrPush(&p->vNtks,Entry);
    Entry->NameId = NameId;
    Entry->pDesign = p;
    Vec_IntGrow(&Entry->vCis,nCis);
    Vec_IntGrow(&Entry->vCos,nCos);
    Vec_StrGrow(&Entry->vObjType,nObjs + 1);
    Vec_StrPush(&Entry->vObjType,'\0');
    Vec_IntGrow(&Entry->vObjFans,nObjs + 1);
    Vec_IntPush(&Entry->vObjFans,-1);
    Vec_IntGrow(&Entry->vFanSto,nObjs * 3);
    return Entry;
  }
  __assert_fail("nCis >= 0 && nCos >= 0 && nObjs >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x249,"Acb_Ntk_t *Acb_NtkAlloc(Acb_Man_t *, int, int, int, int)");
}

Assistant:

static inline Acb_Ntk_t *  Acb_NtkAlloc( Acb_Man_t * p, int NameId, int nCis, int nCos, int nObjs )
{    
    Acb_Ntk_t * pNew = ABC_CALLOC( Acb_Ntk_t, 1 );
    assert( nCis >= 0 && nCos >= 0 && nObjs >= 0 );
    pNew->Id      = Vec_PtrSize(&p->vNtks);   Vec_PtrPush( &p->vNtks, pNew );
    pNew->NameId  = NameId;
    pNew->pDesign = p;
    Vec_IntGrow( &pNew->vCis, nCis );
    Vec_IntGrow( &pNew->vCos, nCos );
    Vec_StrGrow( &pNew->vObjType, nObjs+1 );  Vec_StrPush( &pNew->vObjType,  (char)ABC_OPER_NONE );
    Vec_IntGrow( &pNew->vObjFans, nObjs+1 );  Vec_IntPush( &pNew->vObjFans, -1 );
    Vec_IntGrow( &pNew->vFanSto,  3*nObjs );  
    return pNew;
}